

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TeamCityReporter::testRunEnded(TeamCityReporter *this,TestRunStats *runStats)

{
  ostream *poVar1;
  size_type in_RCX;
  StringRef str;
  string local_38;
  TestRunStats *local_18;
  TestRunStats *runStats_local;
  TeamCityReporter *this_local;
  
  local_18 = runStats;
  runStats_local = (TestRunStats *)this;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "##teamcity[testSuiteFinished name=\'");
  str.m_size = in_RCX;
  str.m_start = (char *)(local_18->runInfo).name.m_size;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)(local_18->runInfo).name.m_start,str);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void TeamCityReporter::testRunEnded( TestRunStats const& runStats ) {
        m_stream << "##teamcity[testSuiteFinished name='"
               << escape( runStats.runInfo.name ) << "']\n";
    }